

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebugManager::GetSource(JsrtDebugManager *this,ScriptContext *scriptContext,uint scriptId)

{
  ScriptContext *pSVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_00;
  bool bVar3;
  int iVar4;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar5;
  DynamicObject *pDVar6;
  int i;
  long lVar7;
  ScriptContext **ppSVar8;
  Utf8SourceInfo *utf8SourceInfo;
  
  ppSVar8 = &this->threadContext->scriptContextList;
  utf8SourceInfo = (Utf8SourceInfo *)0x0;
  while ((pSVar1 = *ppSVar8, pSVar1 != (ScriptContext *)0x0 &&
         (utf8SourceInfo == (Utf8SourceInfo *)0x0))) {
    iVar4 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar1);
    if ((char)iVar4 != '\0') goto LAB_003960ef;
    pLVar5 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&pSVar1->sourceList);
    utf8SourceInfo = (Utf8SourceInfo *)0x0;
    for (lVar7 = 0;
        lVar7 < (pLVar5->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar7 = lVar7 + 1) {
      pRVar2 = (pLVar5->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar7].ptr;
      if ((((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (this_00 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
            this_00 != (Utf8SourceInfo *)0x0)) {
        bVar3 = Js::Utf8SourceInfo::IsInDebugMode(this_00);
        if ((bVar3) && (this_00->m_sourceInfoId == scriptId)) {
          utf8SourceInfo = this_00;
        }
      }
    }
    ppSVar8 = &pSVar1->next;
  }
  if (utf8SourceInfo == (Utf8SourceInfo *)0x0) {
LAB_003960ef:
    pDVar6 = (DynamicObject *)0x0;
  }
  else {
    pSVar1 = (utf8SourceInfo->m_scriptContext).ptr;
    pDVar6 = Js::JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    pDVar6 = (DynamicObject *)Js::CrossSite::MarshalVar(pSVar1,pDVar6,false);
    JsrtDebugUtils::AddSourceMetadataToObject(pDVar6,utf8SourceInfo);
    JsrtDebugUtils::AddSourceToObject(pDVar6,utf8SourceInfo);
  }
  return pDVar6;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::GetSource(Js::ScriptContext* scriptContext, uint scriptId)
{
    Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

    for (Js::ScriptContext *tempScriptContext = this->threadContext->GetScriptContextList();
    tempScriptContext != nullptr && utf8SourceInfo == nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
        {
            if (sourceInfo->IsInDebugMode() && sourceInfo->GetSourceInfoId() == scriptId)
            {
                utf8SourceInfo = sourceInfo;
                return true;
            }
            return false;
        });
    }

    Js::DynamicObject* sourceObject = nullptr;

    if (utf8SourceInfo != nullptr)
    {
        sourceObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(utf8SourceInfo->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddSourceMetadataToObject(sourceObject, utf8SourceInfo);
        JsrtDebugUtils::AddSourceToObject(sourceObject, utf8SourceInfo);
    }

    return sourceObject;
}